

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filters.cpp
# Opt level: O2

string * __thiscall
pbrt::GaussianFilter::ToString_abi_cxx11_(string *__return_storage_ptr__,GaussianFilter *this)

{
  FilterSampler *in_stack_fffffffffffffff0;
  
  StringPrintf<pbrt::Vector2<float>const&,float_const&,float_const&,float_const&,pbrt::FilterSampler_const&>
            (__return_storage_ptr__,
             (pbrt *)"[ GaussianFilter radius: %s sigma: %f expX: %f expY: %f sampler: %s ]",
             (char *)this,(Vector2<float> *)&this->sigma,&this->expX,&this->expY,
             (float *)&this->sampler,in_stack_fffffffffffffff0);
  return __return_storage_ptr__;
}

Assistant:

std::string GaussianFilter::ToString() const {
    return StringPrintf(
        "[ GaussianFilter radius: %s sigma: %f expX: %f expY: %f sampler: %s ]", radius,
        sigma, expX, expY, sampler);
}